

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O2

uint64 CityHash64WithSeed(char *s,size_t len,uint64 seed)

{
  uint64 uVar1;
  
  uVar1 = CityHash64WithSeeds(s,len,0x9ae16a3b2f90404f,seed);
  return uVar1;
}

Assistant:

uint64 CityHash64WithSeed(const char *s, size_t len, uint64 seed) {
  return CityHash64WithSeeds(s, len, k2, seed);
}